

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O3

void __thiscall
ContractTestOnClassWithOutInvariant_ThatWhenNoFunctionWasCalledNoConditionWasCalled_Test::TestBody
          (ContractTestOnClassWithOutInvariant_ThatWhenNoFunctionWasCalledNoConditionWasCalled_Test
           *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28;
  
  bVar1 = (this->super_ContractTestOnClassWithOutInvariant).sut.preConditionWasCalled;
  local_38[0] = (internal)(bVar1 ^ 1);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == true) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"sut.preConditionWasCalled","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0xc2,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = (this->super_ContractTestOnClassWithOutInvariant).sut.postConditionWasCalled;
  local_38[0] = (internal)(bVar1 ^ 1);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == true) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"sut.postConditionWasCalled","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0xc3,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithOutInvariant, ThatWhenNoFunctionWasCalledNoConditionWasCalled)
{
  EXPECT_FALSE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);
}